

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool list_exec(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  long lVar1;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t value_01;
  uint32_t n_00;
  gravity_fiber_t *pgVar2;
  void *pvVar3;
  undefined8 *puVar4;
  long local_2088;
  uint local_205c;
  uint32_t i;
  char local_2048 [8];
  char _buffer_1 [4096];
  gravity_list_t *list;
  uint32_t n;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if ((nargs == 2) && (args[1].isa == gravity_class_int)) {
    n_00 = (uint32_t)args[1].field_1.n;
    _buffer_1._4088_8_ = gravity_list_new(vm,n_00);
    if ((gravity_list_t *)_buffer_1._4088_8_ == (gravity_list_t *)0x0) {
      snprintf(local_2048,0x1000,"Maximum List allocation size reached (%d).",0x400000);
      pgVar2 = gravity_vm_fiber(vm);
      gravity_fiber_seterror(pgVar2,local_2048);
      value_00.field_1.n = 0;
      value_00.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
      vm_local._7_1_ = false;
    }
    else {
      for (local_205c = 0; local_205c < n_00; local_205c = local_205c + 1) {
        if (*(long *)(_buffer_1._4088_8_ + 0x30) == *(long *)(_buffer_1._4088_8_ + 0x38)) {
          if (*(long *)(_buffer_1._4088_8_ + 0x38) == 0) {
            local_2088 = 8;
          }
          else {
            local_2088 = *(long *)(_buffer_1._4088_8_ + 0x38) << 1;
          }
          *(long *)(_buffer_1._4088_8_ + 0x38) = local_2088;
          pvVar3 = realloc(*(void **)(_buffer_1._4088_8_ + 0x40),
                           *(long *)(_buffer_1._4088_8_ + 0x38) << 4);
          *(void **)(_buffer_1._4088_8_ + 0x40) = pvVar3;
        }
        lVar1 = *(long *)(_buffer_1._4088_8_ + 0x30);
        *(long *)(_buffer_1._4088_8_ + 0x30) = lVar1 + 1;
        puVar4 = (undefined8 *)(*(long *)(_buffer_1._4088_8_ + 0x40) + lVar1 * 0x10);
        *puVar4 = gravity_class_null;
        puVar4[1] = 0;
      }
      value.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)_buffer_1._4088_8_;
      value.isa = *(gravity_class_t **)_buffer_1._4088_8_;
      gravity_vm_setslot(vm,value,_buffer._4088_4_);
      vm_local._7_1_ = true;
    }
  }
  else {
    snprintf(local_1028,0x1000,"An Int value is expected as argument of list_exec.");
    pgVar2 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar2,local_1028);
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool list_exec (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if ((nargs != 2) || (!VALUE_ISA_INT(GET_VALUE(1)))) RETURN_ERROR("An Int value is expected as argument of list_exec.");

    uint32_t n = (uint32_t)VALUE_AS_INT(GET_VALUE(1));
    gravity_list_t *list = gravity_list_new(vm, n);
    if (!list) RETURN_ERROR("Maximum List allocation size reached (%d).", MAX_ALLOCATION);

    for (uint32_t i=0; i<n; ++i) {
        marray_push(gravity_value_t, list->array, VALUE_FROM_NULL);
    }

    RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
}